

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  int iVar1;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    iVar1 = ((this->field_0).repeated_int32_value)->current_size_;
    break;
  case 9:
  case 10:
    iVar1 = (int)((this->field_0).string_value)->_M_string_length;
    break;
  default:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/extension_set.cc",0x6b7);
    other = LogMessage::operator<<(&local_40,"Can\'t get here.");
    LogFinisher::operator=(&local_41,other);
    LogMessage::~LogMessage(&local_40);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  GOOGLE_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return 0;
}